

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

void __thiscall
ArgumentParser::Instance::Bind
          (Instance *this,
          MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *val)

{
  ExpectAtLeast local_48;
  anon_class_8_1_ba1d8281_conflict1 local_40;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_38;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *val_local;
  Instance *this_local;
  
  local_40.val = val;
  local_18 = val;
  val_local = (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this;
  std::function<ArgumentParser::Continue(std::basic_string_view<char,std::char_traits<char>>)>::
  function<ArgumentParser::Instance::Bind(ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&)::__0,void>
            ((function<ArgumentParser::Continue(std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_38,&local_40);
  ExpectAtLeast::ExpectAtLeast(&local_48,0);
  Bind(this,&local_38,local_48);
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_38);
  return;
}

Assistant:

void Instance::Bind(MaybeEmpty<std::vector<std::string>>& val)
{
  this->Bind(
    [&val](cm::string_view arg) -> Continue {
      val.emplace_back(arg);
      return Continue::Yes;
    },
    ExpectAtLeast{ 0 });
}